

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

Am_Wrapper * sub_menu_font_from_win_for_item_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Value v;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value local_18;
  
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)self,0x68);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&AStack_28,0x1d3);
  in_value = Am_Object::Get(&local_20,0xac,1);
  Am_Value::operator=(&local_18,in_value);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&AStack_28);
  bVar1 = Am_Value::Valid(&local_18);
  if (bVar1) {
    pAVar2 = Am_Value::operator_cast_to_Am_Wrapper_(&local_18);
  }
  else {
    pAVar2 = Am_Font::operator_cast_to_Am_Wrapper_(&Am_Default_Font);
  }
  Am_Value::~Am_Value(&local_18);
  return pAVar2;
}

Assistant:

Am_Define_Font_Formula(sub_menu_font_from_win_for_item)
{
  Am_Value v;
  v = self.Get_Object(Am_WINDOW).Get_Object(Am_FOR_ITEM).Peek(Am_FONT);
  if (v.Valid())
    return v;
  else
    return Am_Default_Font;
}